

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall kj::Array<const_kj::StringPtr>::~Array(Array<const_kj::StringPtr> *this)

{
  Array<const_kj::StringPtr> *this_local;
  
  dispose(this);
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }